

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::playMsgNow(Synth *this,Bit32u msg)

{
  byte part;
  bool bVar1;
  Bit8u (*paBVar2) [9];
  uint local_24;
  Bit32u partNum;
  Bit32u i;
  Bit8u *chanParts;
  Bit8u velocity;
  Bit8u note;
  Bit8u chan;
  Bit8u code;
  Bit32u msg_local;
  Synth *this_local;
  
  if ((this->opened & 1U) != 0) {
    paBVar2 = this->extensions->chantable + ((byte)msg & 0xf);
    if ((*paBVar2)[0] < 9) {
      local_24 = this->extensions->abortingPartIx;
      while( true ) {
        if (8 < local_24) {
          return;
        }
        part = (*paBVar2)[local_24];
        if (8 < part) {
          return;
        }
        playMsgOnPart(this,part,(Bit8u)((msg & 0xf0) >> 4),(byte)(msg >> 8) & 0x7f,
                      (byte)(msg >> 0x10) & 0x7f);
        bVar1 = isAbortingPoly(this);
        if (bVar1) break;
        if (this->extensions->abortingPartIx != 0) {
          this->extensions->abortingPartIx = 0;
        }
        local_24 = local_24 + 1;
      }
      this->extensions->abortingPartIx = local_24;
    }
  }
  return;
}

Assistant:

void Synth::playMsgNow(Bit32u msg) {
	if (!opened) return;

	// NOTE: Active sense IS implemented in real hardware. However, realtime processing is clearly out of the library scope.
	//       It is assumed that realtime consumers of the library respond to these MIDI events as appropriate.

	Bit8u code = Bit8u((msg & 0x0000F0) >> 4);
	Bit8u chan = Bit8u(msg & 0x00000F);
	Bit8u note = Bit8u((msg & 0x007F00) >> 8);
	Bit8u velocity = Bit8u((msg & 0x7F0000) >> 16);

	//printDebug("Playing chan %d, code 0x%01x note: 0x%02x", chan, code, note);

	Bit8u *chanParts = extensions.chantable[chan];
	if (*chanParts > 8) {
#if MT32EMU_MONITOR_MIDI > 0
		printDebug("Play msg on unreg chan %d (%d): code=0x%01x, vel=%d", chan, *chanParts, code, velocity);
#endif
		return;
	}
	for (Bit32u i = extensions.abortingPartIx; i <= 8; i++) {
		const Bit32u partNum = chanParts[i];
		if (partNum > 8) break;
		playMsgOnPart(partNum, code, note, velocity);
		if (isAbortingPoly()) {
			extensions.abortingPartIx = i;
			break;
		} else if (extensions.abortingPartIx) {
			extensions.abortingPartIx = 0;
		}
	}
}